

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

Element * __thiscall Rml::Element::GetElementById(Element *this,String *id)

{
  bool bVar1;
  ElementDocument *pEVar2;
  Element *pEVar3;
  
  bVar1 = ::std::operator==(id,"#self");
  if (!bVar1) {
    bVar1 = ::std::operator==(id,"#document");
    if (bVar1) {
      pEVar2 = GetOwnerDocument(this);
      return &pEVar2->super_Element;
    }
    bVar1 = ::std::operator==(id,"#parent");
    if (!bVar1) {
      pEVar2 = GetOwnerDocument(this);
      if (pEVar2 != (ElementDocument *)0x0) {
        this = &pEVar2->super_Element;
      }
      pEVar3 = ElementUtilities::GetElementById(this,id);
      return pEVar3;
    }
    this = this->parent;
  }
  return this;
}

Assistant:

Element* Element::GetElementById(const String& id)
{
	// Check for special-case tokens.
	if (id == "#self")
		return this;
	else if (id == "#document")
		return GetOwnerDocument();
	else if (id == "#parent")
		return this->parent;
	else
	{
		Element* search_root = GetOwnerDocument();
		if (search_root == nullptr)
			search_root = this;
		return ElementUtilities::GetElementById(search_root, id);
	}
}